

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall deci::ast_identifier_t::~ast_identifier_t(ast_identifier_t *this)

{
  ast_identifier_t *this_local;
  
  ~ast_identifier_t(this);
  operator_delete(this);
  return;
}

Assistant:

ast_identifier_t::~ast_identifier_t() {
    ;
  }